

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall
notch::core::ActivationLayer::ActivationLayer(ActivationLayer *this,size_t n,Activation *af)

{
  ulong __n;
  float *pfVar1;
  
  (this->super_ABackpropLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ABackpropLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ABackpropLayer)._vptr_ABackpropLayer = (_func_int **)&PTR_tag_abi_cxx11__001278e8;
  this->nSize = n;
  this->activationFunction = af;
  (this->activationGrad)._M_size = n;
  __n = n * 4;
  pfVar1 = (float *)operator_new(__n);
  (this->activationGrad)._M_data = pfVar1;
  memset(pfVar1,0,__n);
  (this->propagatedErrors)._M_size = n;
  pfVar1 = (float *)operator_new(__n);
  (this->propagatedErrors)._M_data = pfVar1;
  memset(pfVar1,0,__n);
  return;
}

Assistant:

ActivationLayer(size_t n, const Activation &af)
        : nSize(n), activationFunction(&af),
          activationGrad(n), propagatedErrors(n) {}